

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O1

ostream * jbcoin::operator<<(ostream *out,STBase *t)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*t->_vptr_STBase[5])(&local_30);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& out, const STBase& t)
{
    return out << t.getFullText ();
}